

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemodel.hh
# Opt level: O3

set<const_Typelib::Type_*,_std::less<const_Typelib::Type_*>,_std::allocator<const_Typelib::Type_*>_>
* __thiscall Typelib::NullType::dependsOn(NullType *this)

{
  _Rb_tree_header *p_Var1;
  set<const_Typelib::Type_*,_std::less<const_Typelib::Type_*>,_std::allocator<const_Typelib::Type_*>_>
  *in_RDI;
  
  p_Var1 = &(in_RDI->_M_t)._M_impl.super__Rb_tree_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl = 0;
  *(undefined8 *)&(in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (in_RDI->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  return in_RDI;
}

Assistant:

virtual std::set<Type const*> dependsOn() const { return std::set<Type const*>(); }